

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_39dd::test_of_ptr(void **param_1)

{
  _Bool _Var1;
  long lVar2;
  roaring64_bitmap_t *r;
  uint64_t uVar3;
  uint64_t i;
  array<unsigned_long,_1000UL> vals;
  uint64_t local_1f60 [1000];
  
  uVar3 = 0;
  for (lVar2 = 8000; lVar2 != 0; lVar2 = lVar2 + -8) {
    local_1f60[uVar3] = uVar3;
    uVar3 = uVar3 + 1;
  }
  r = roaring64_bitmap_of_ptr(1000,local_1f60);
  assert_r64_valid((roaring64_bitmap_t *)r);
  for (lVar2 = 0; lVar2 != 1000; lVar2 = lVar2 + 1) {
    _Var1 = roaring64_bitmap_contains(r,local_1f60[lVar2]);
    _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, vals[i])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x89);
  }
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_of_ptr) {
    std::array<uint64_t, 1000> vals;
    std::iota(vals.begin(), vals.end(), 0);
    roaring64_bitmap_t* r = roaring64_bitmap_of_ptr(vals.size(), vals.data());
    assert_r64_valid(r);
    for (uint64_t i = 0; i < 1000; ++i) {
        assert_true(roaring64_bitmap_contains(r, vals[i]));
    }
    roaring64_bitmap_free(r);
}